

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slb_test.cc
# Opt level: O3

int main(void)

{
  pointer pcVar1;
  void *pvVar2;
  long lVar3;
  void *pvVar4;
  char *pcVar5;
  SlbCreateLoadBalancerHTTPListenerRequestType *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *proxy_host;
  HttpTestListener *pHVar7;
  SlbSetLoadBalancerHTTPListenerAttributeRequestType *proxy_host_00;
  HttpTestListener *pHVar8;
  undefined8 extraout_RAX;
  SlbCreateLoadBalancerHTTPListenerResponseType resp_2;
  SlbAddBackendServersResponseType resp;
  SlbAddBackendServersRequestType req;
  undefined7 *local_3b8;
  undefined8 local_3b0;
  undefined7 local_3a8;
  undefined1 uStack_3a1;
  undefined1 uStack_3a0;
  undefined2 uStack_39f;
  undefined1 local_39d;
  undefined1 local_398 [64];
  undefined1 local_358 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  char *pcStack_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  undefined8 local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  undefined8 local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  undefined8 local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  undefined8 local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  undefined8 local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined8 local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  paVar6 = &local_288;
  local_298._8_8_ = (char *)0x0;
  local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
  local_278._M_p = (pointer)&local_268;
  pcStack_270 = (char *)0x0;
  local_268._M_allocated_capacity = local_268._M_allocated_capacity & 0xffffffffffffff00;
  local_258._M_allocated_capacity = (size_type)&local_248;
  local_258._8_8_ = (char *)0x0;
  local_248._M_allocated_capacity = local_248._M_allocated_capacity & 0xffffffffffffff00;
  local_238._M_allocated_capacity = (size_type)&local_228;
  local_238._8_8_ = (char *)0x0;
  local_228._M_allocated_capacity = local_228._M_allocated_capacity & 0xffffffffffffff00;
  pvVar2 = (void *)((long)&local_2f8 + 8);
  local_308._M_local_buf[0] = '\0';
  local_308._M_allocated_capacity._1_6_ = 0;
  local_318._M_allocated_capacity = 0;
  local_318._8_8_ = 0;
  local_308._8_3_ = SUB83(pvVar2,0);
  local_308._M_local_buf[7] = '\0';
  local_308._M_local_buf[0xb] = (char)((ulong)pvVar2 >> 0x18);
  local_308._12_4_ = (undefined4)((ulong)pvVar2 >> 0x20);
  local_2f8._M_allocated_capacity = 0;
  local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
  local_3a8 = 0x676e61682d6e63;
  uStack_3a1 = 0x7a;
  uStack_3a0 = 0x68;
  uStack_39f = 0x756f;
  local_3b0 = 0xb;
  local_39d = 0;
  pcVar1 = local_398 + 0x30;
  local_398._48_8_ = 0x64697070615f796d;
  local_398._40_8_ = 8;
  local_398._56_2_ = local_398._56_2_ & 0xff00;
  local_328._M_allocated_capacity._0_7_ = 0x726365735f796d;
  local_328._M_local_buf[7] = 'e';
  local_328._M_local_buf[8] = 't';
  local_338._8_8_ = 9;
  local_328._M_local_buf[9] = '\0';
  local_3b8 = &local_3a8;
  local_398._32_8_ = pcVar1;
  local_338._M_allocated_capacity = (size_type)&local_328;
  local_298._M_allocated_capacity = (size_type)paVar6;
  this = (SlbCreateLoadBalancerHTTPListenerRequestType *)
         aliyun::Slb::CreateSlbClient(&local_3b8,local_398 + 0x20,&local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_allocated_capacity != &local_328) {
    operator_delete((void *)local_338._M_allocated_capacity,
                    CONCAT17(local_328._M_local_buf[7],local_328._M_allocated_capacity._0_7_) + 1);
  }
  if ((pointer)local_398._32_8_ != pcVar1) {
    operator_delete((void *)local_398._32_8_,local_398._48_8_ + 1);
  }
  if (local_3b8 != &local_3a8) {
    operator_delete(local_3b8,CONCAT17(uStack_3a1,local_3a8) + 1);
  }
  if (this == (SlbCreateLoadBalancerHTTPListenerRequestType *)0x0) {
    pvVar4 = (void *)CONCAT44(local_308._12_4_,CONCAT13(local_308._M_local_buf[0xb],local_308._8_3_)
                             );
    if (pvVar4 != pvVar2) {
      operator_delete(pvVar4,local_2f8._8_8_ + 1);
    }
    std::
    vector<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
    ::~vector((vector<aliyun::SlbAddBackendServersBackendServerType,_std::allocator<aliyun::SlbAddBackendServersBackendServerType>_>
               *)&local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      (ulong)(local_248._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != &local_268) {
      operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_allocated_capacity != paVar6) {
      operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1);
    }
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_298._8_8_ = (char *)0x0;
    local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
    local_278._M_p = (pointer)&local_268;
    pcStack_270 = (char *)0x0;
    local_268._M_allocated_capacity = local_268._M_allocated_capacity & 0xffffffffffffff00;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_258._8_8_ = (char *)0x0;
    local_248._M_allocated_capacity = local_248._M_allocated_capacity & 0xffffffffffffff00;
    local_238._M_allocated_capacity = (size_type)&local_228;
    local_238._8_8_ = (char *)0x0;
    local_228._M_allocated_capacity = local_228._M_allocated_capacity & 0xffffffffffffff00;
    local_218._8_8_ = (char *)0x0;
    local_208._M_allocated_capacity = local_208._M_allocated_capacity & 0xffffffffffffff00;
    local_1f8._M_allocated_capacity = (size_type)&local_1e8;
    local_1f8._8_8_ = 0;
    local_1e8._M_allocated_capacity = local_1e8._M_allocated_capacity & 0xffffffffffffff00;
    local_1d8._M_allocated_capacity = (size_type)&local_1c8;
    local_1d8._8_8_ = 0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._M_allocated_capacity = (size_type)&local_1a8;
    local_1b8._8_8_ = 0;
    local_1a8._M_allocated_capacity = local_1a8._M_allocated_capacity & 0xffffffffffffff00;
    local_198._M_allocated_capacity = (size_type)&local_188;
    local_198._8_8_ = 0;
    local_188._M_allocated_capacity = local_188._M_allocated_capacity & 0xffffffffffffff00;
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_3a8 = 0x676e61682d6e63;
    uStack_3a1 = 0x7a;
    uStack_3a0 = 0x68;
    uStack_39f = 0x756f;
    local_3b0 = 0xb;
    local_39d = 0;
    local_398._48_8_ = 0x64697070615f796d;
    local_398._40_8_ = 8;
    local_398._56_2_ = local_398._56_2_ & 0xff00;
    local_328._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_328._M_local_buf[7] = 'e';
    local_328._M_local_buf[8] = 't';
    local_338._8_8_ = 9;
    local_328._M_local_buf[9] = '\0';
    local_3b8 = &local_3a8;
    local_398._32_8_ = pcVar1;
    local_338._M_allocated_capacity = (size_type)&local_328;
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_298._M_allocated_capacity = (size_type)paVar6;
    this = (SlbCreateLoadBalancerHTTPListenerRequestType *)aliyun::Slb::CreateSlbClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_allocated_capacity != &local_328) {
      operator_delete((void *)local_338._M_allocated_capacity,
                      CONCAT17(local_328._M_local_buf[7],local_328._M_allocated_capacity._0_7_) + 1)
      ;
    }
    if ((pointer)local_398._32_8_ != pcVar1) {
      operator_delete((void *)local_398._32_8_,local_398._48_8_ + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,CONCAT17(uStack_3a1,local_3a8) + 1);
    }
    if (this != (SlbCreateLoadBalancerHTTPListenerRequestType *)0x0) goto LAB_001081fc;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_allocated_capacity != &local_2c8) {
      operator_delete((void *)local_2d8._M_allocated_capacity,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_allocated_capacity != &local_2e8) {
      operator_delete((void *)local_2f8._M_allocated_capacity,
                      CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT17(local_308._M_local_buf[7],
                               CONCAT61(local_308._M_allocated_capacity._1_6_,
                                        local_308._M_local_buf[0])) + 1);
    }
    aliyun::SlbCreateLoadBalancerRequestType::~SlbCreateLoadBalancerRequestType
              ((SlbCreateLoadBalancerRequestType *)&local_298);
    local_298._8_8_ = (char *)0x0;
    local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
    local_278._M_p = (pointer)&local_268;
    pcStack_270 = (char *)0x0;
    local_268._M_allocated_capacity = local_268._M_allocated_capacity & 0xffffffffffffff00;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_258._8_8_ = (char *)0x0;
    local_248._M_allocated_capacity = local_248._M_allocated_capacity & 0xffffffffffffff00;
    local_238._M_allocated_capacity = (size_type)&local_228;
    local_238._8_8_ = (char *)0x0;
    local_228._M_allocated_capacity = local_228._M_allocated_capacity & 0xffffffffffffff00;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_218._8_8_ = (char *)0x0;
    local_208._M_allocated_capacity = local_208._M_allocated_capacity & 0xffffffffffffff00;
    local_1f8._M_allocated_capacity = (size_type)&local_1e8;
    local_1f8._8_8_ = 0;
    local_1e8._M_allocated_capacity = local_1e8._M_allocated_capacity & 0xffffffffffffff00;
    local_1d8._M_allocated_capacity = (size_type)&local_1c8;
    local_1d8._8_8_ = 0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._M_allocated_capacity = (size_type)&local_1a8;
    local_1b8._8_8_ = 0;
    local_1a8._M_allocated_capacity = local_1a8._M_allocated_capacity & 0xffffffffffffff00;
    local_198._M_allocated_capacity = (size_type)&local_188;
    local_198._8_8_ = 0;
    local_188._M_allocated_capacity = local_188._M_allocated_capacity & 0xffffffffffffff00;
    local_178._M_allocated_capacity = (size_type)&local_168;
    local_178._8_8_ = 0;
    local_168._M_local_buf[0] = '\0';
    local_158._M_allocated_capacity = (size_type)&local_148;
    local_158._8_8_ = 0;
    local_148._M_local_buf[0] = '\0';
    local_138._M_allocated_capacity = (size_type)&local_128;
    local_138._8_8_ = 0;
    local_128._M_local_buf[0] = '\0';
    local_118._M_allocated_capacity = (size_type)&local_108;
    local_118._8_8_ = 0;
    local_108._M_local_buf[0] = '\0';
    local_f8 = &local_e8;
    local_f0 = 0;
    local_e8._M_local_buf[0] = '\0';
    local_d8 = &local_c8;
    local_d0 = 0;
    local_c8._M_local_buf[0] = '\0';
    local_b8 = &local_a8;
    local_b0 = 0;
    local_a8._M_local_buf[0] = '\0';
    local_98 = &local_88;
    local_90 = 0;
    local_88._M_local_buf[0] = '\0';
    local_78 = &local_68;
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    local_58 = &local_48;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    local_308._M_local_buf[0] = 'c';
    local_308._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_308._M_local_buf[7] = 'z';
    local_308._8_3_ = 0x756f68;
    local_318._8_8_ = 0xb;
    local_308._M_local_buf[0xb] = '\0';
    local_3a8 = 0x697070615f796d;
    uStack_3a1 = 100;
    local_3b0 = 8;
    uStack_3a0 = 0;
    local_398._48_8_ = 0x65726365735f796d;
    local_398._56_2_ = 0x74;
    local_398._40_8_ = 9;
    local_3b8 = &local_3a8;
    local_398._32_8_ = pcVar1;
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_298._M_allocated_capacity = (size_type)paVar6;
    this = (SlbCreateLoadBalancerHTTPListenerRequestType *)aliyun::Slb::CreateSlbClient();
    if ((pointer)local_398._32_8_ != pcVar1) {
      operator_delete((void *)local_398._32_8_,local_398._48_8_ + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,CONCAT17(uStack_3a1,local_3a8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT17(local_308._M_local_buf[7],
                               CONCAT61(local_308._M_allocated_capacity._1_6_,
                                        local_308._M_local_buf[0])) + 1);
    }
    if (this != (SlbCreateLoadBalancerHTTPListenerRequestType *)0x0) goto LAB_001083aa;
    aliyun::SlbCreateLoadBalancerHTTPListenerRequestType::
    ~SlbCreateLoadBalancerHTTPListenerRequestType
              ((SlbCreateLoadBalancerHTTPListenerRequestType *)&local_298);
    local_298._8_8_ = (char *)0x0;
    local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
    local_278._M_p = (pointer)&local_268;
    pcStack_270 = (char *)0x0;
    local_268._M_allocated_capacity = local_268._M_allocated_capacity & 0xffffffffffffff00;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_258._8_8_ = (char *)0x0;
    local_248._M_allocated_capacity = local_248._M_allocated_capacity & 0xffffffffffffff00;
    local_238._M_allocated_capacity = (size_type)&local_228;
    local_238._8_8_ = (char *)0x0;
    local_228._M_allocated_capacity = local_228._M_allocated_capacity & 0xffffffffffffff00;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_218._8_8_ = (char *)0x0;
    local_208._M_allocated_capacity = local_208._M_allocated_capacity & 0xffffffffffffff00;
    local_1f8._M_allocated_capacity = (size_type)&local_1e8;
    local_1f8._8_8_ = 0;
    local_1e8._M_allocated_capacity = local_1e8._M_allocated_capacity & 0xffffffffffffff00;
    local_1d8._M_allocated_capacity = (size_type)&local_1c8;
    local_1d8._8_8_ = 0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._M_allocated_capacity = (size_type)&local_1a8;
    local_1b8._8_8_ = 0;
    local_1a8._M_allocated_capacity = local_1a8._M_allocated_capacity & 0xffffffffffffff00;
    local_198._M_allocated_capacity = (size_type)&local_188;
    local_198._8_8_ = 0;
    local_188._M_allocated_capacity = local_188._M_allocated_capacity & 0xffffffffffffff00;
    local_178._M_allocated_capacity = (size_type)&local_168;
    local_178._8_8_ = 0;
    local_168._M_local_buf[0] = '\0';
    local_158._M_allocated_capacity = (size_type)&local_148;
    local_158._8_8_ = 0;
    local_148._M_local_buf[0] = '\0';
    local_138._M_allocated_capacity = (size_type)&local_128;
    local_138._8_8_ = 0;
    local_128._M_local_buf[0] = '\0';
    local_308._M_local_buf[0] = 'c';
    local_308._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_308._M_local_buf[7] = 'z';
    local_308._8_3_ = 0x756f68;
    local_318._8_8_ = 0xb;
    local_308._M_local_buf[0xb] = '\0';
    local_3a8 = 0x697070615f796d;
    uStack_3a1 = 100;
    local_3b0 = 8;
    uStack_3a0 = 0;
    local_398._48_8_ = 0x65726365735f796d;
    local_398._56_2_ = 0x74;
    local_398._40_8_ = 9;
    local_3b8 = &local_3a8;
    local_398._32_8_ = pcVar1;
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_298._M_allocated_capacity = (size_type)paVar6;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)aliyun::Slb::CreateSlbClient();
    if ((pointer)local_398._32_8_ != pcVar1) {
      operator_delete((void *)local_398._32_8_,local_398._48_8_ + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,CONCAT17(uStack_3a1,local_3a8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT17(local_308._M_local_buf[7],
                               CONCAT61(local_308._M_allocated_capacity._1_6_,
                                        local_308._M_local_buf[0])) + 1);
    }
    if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) goto LAB_00108613;
    aliyun::SlbCreateLoadBalancerTCPListenerRequestType::
    ~SlbCreateLoadBalancerTCPListenerRequestType
              ((SlbCreateLoadBalancerTCPListenerRequestType *)&local_298);
    paVar6 = &local_288;
    local_298._8_8_ = (char *)0x0;
    local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
    local_278._M_p = (pointer)&local_268;
    pcStack_270 = (char *)0x0;
    local_268._M_allocated_capacity = local_268._M_allocated_capacity & 0xffffffffffffff00;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_258._8_8_ = (char *)0x0;
    local_248._M_allocated_capacity = local_248._M_allocated_capacity & 0xffffffffffffff00;
    local_238._M_allocated_capacity = (size_type)&local_228;
    local_238._8_8_ = (char *)0x0;
    local_228._M_allocated_capacity = local_228._M_allocated_capacity & 0xffffffffffffff00;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_218._8_8_ = (char *)0x0;
    local_208._M_allocated_capacity = local_208._M_allocated_capacity & 0xffffffffffffff00;
    local_308._M_local_buf[0] = 'c';
    local_308._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_308._M_local_buf[7] = 'z';
    local_308._8_3_ = 0x756f68;
    local_318._8_8_ = 0xb;
    local_308._M_local_buf[0xb] = '\0';
    local_3a8 = 0x697070615f796d;
    uStack_3a1 = 100;
    local_3b0 = 8;
    uStack_3a0 = 0;
    local_398._48_8_ = 0x65726365735f796d;
    local_398._40_8_ = 9;
    local_398._56_2_ = 0x74;
    local_3b8 = &local_3a8;
    local_398._32_8_ = pcVar1;
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_298._M_allocated_capacity = (size_type)paVar6;
    proxy_host = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)aliyun::Slb::CreateSlbClient();
    if ((pointer)local_398._32_8_ != pcVar1) {
      operator_delete((void *)local_398._32_8_,local_398._48_8_ + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,CONCAT17(uStack_3a1,local_3a8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT17(local_308._M_local_buf[7],
                               CONCAT61(local_308._M_allocated_capacity._1_6_,
                                        local_308._M_local_buf[0])) + 1);
    }
    if (proxy_host !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_001087ef;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,local_208._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      (ulong)(local_248._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != &local_268) {
      operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_allocated_capacity != paVar6) {
      operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1);
    }
    local_298._8_8_ = (char *)0x0;
    local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
    local_278._M_p = (pointer)&local_268;
    pcStack_270 = (char *)0x0;
    local_268._M_allocated_capacity = local_268._M_allocated_capacity & 0xffffffffffffff00;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_258._8_8_ = (char *)0x0;
    local_248._M_allocated_capacity = local_248._M_allocated_capacity & 0xffffffffffffff00;
    local_238._M_allocated_capacity = (size_type)&local_228;
    local_238._8_8_ = (char *)0x0;
    local_228._M_allocated_capacity = local_228._M_allocated_capacity & 0xffffffffffffff00;
    local_308._M_local_buf[0] = 'c';
    local_308._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_308._M_local_buf[7] = 'z';
    local_308._8_3_ = 0x756f68;
    local_318._8_8_ = 0xb;
    local_308._M_local_buf[0xb] = '\0';
    local_3a8 = 0x697070615f796d;
    uStack_3a1 = 100;
    local_3b0 = 8;
    uStack_3a0 = 0;
    local_398._48_8_ = 0x65726365735f796d;
    local_398._40_8_ = 9;
    local_398._56_2_ = 0x74;
    local_3b8 = &local_3a8;
    local_398._32_8_ = pcVar1;
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_298._M_allocated_capacity = (size_type)paVar6;
    proxy_host = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)aliyun::Slb::CreateSlbClient();
    if ((pointer)local_398._32_8_ != pcVar1) {
      operator_delete((void *)local_398._32_8_,local_398._48_8_ + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,CONCAT17(uStack_3a1,local_3a8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT17(local_308._M_local_buf[7],
                               CONCAT61(local_308._M_allocated_capacity._1_6_,
                                        local_308._M_local_buf[0])) + 1);
    }
    if (proxy_host !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_00108940;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      (ulong)(local_248._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != &local_268) {
      operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_allocated_capacity != paVar6) {
      operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1);
    }
    local_298._8_8_ = (char *)0x0;
    local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
    local_278._M_p = (pointer)&local_268;
    pcStack_270 = (char *)0x0;
    local_268._M_allocated_capacity = local_268._M_allocated_capacity & 0xffffffffffffff00;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_258._8_8_ = (char *)0x0;
    local_248._M_allocated_capacity = local_248._M_allocated_capacity & 0xffffffffffffff00;
    local_238._M_allocated_capacity = (size_type)&local_228;
    local_238._8_8_ = (char *)0x0;
    local_228._M_allocated_capacity = local_228._M_allocated_capacity & 0xffffffffffffff00;
    local_358._16_8_ = (pointer)0x0;
    local_358._0_8_ = (pointer)0x0;
    local_358._8_8_ = (pointer)0x0;
    local_308._M_local_buf[0] = 'c';
    local_308._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_308._M_local_buf[7] = 'z';
    local_308._8_3_ = 0x756f68;
    local_318._8_8_ = 0xb;
    local_308._M_local_buf[0xb] = '\0';
    local_3a8 = 0x697070615f796d;
    uStack_3a1 = 100;
    local_3b0 = 8;
    uStack_3a0 = 0;
    local_398._48_8_ = 0x65726365735f796d;
    local_398._40_8_ = 9;
    local_398._56_2_ = 0x74;
    local_3b8 = &local_3a8;
    local_398._32_8_ = pcVar1;
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_298._M_allocated_capacity = (size_type)paVar6;
    pHVar7 = (HttpTestListener *)aliyun::Slb::CreateSlbClient();
    if ((pointer)local_398._32_8_ != pcVar1) {
      operator_delete((void *)local_398._32_8_,local_398._48_8_ + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,CONCAT17(uStack_3a1,local_3a8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT17(local_308._M_local_buf[7],
                               CONCAT61(local_308._M_allocated_capacity._1_6_,
                                        local_308._M_local_buf[0])) + 1);
    }
    paVar6 = &local_258;
    proxy_host = &local_238;
    if (pHVar7 != (HttpTestListener *)0x0) goto LAB_00108a7d;
    std::
    vector<aliyun::SlbDescribeBackendServersListenerType,_std::allocator<aliyun::SlbDescribeBackendServersListenerType>_>
    ::~vector((vector<aliyun::SlbDescribeBackendServersListenerType,_std::allocator<aliyun::SlbDescribeBackendServersListenerType>_>
               *)local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      (ulong)(local_248._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != &local_268) {
      operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_allocated_capacity != &local_288) {
      operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1);
    }
    local_278._M_p = (pointer)0x0;
    pcStack_270 = (char *)0x0;
    local_288._M_allocated_capacity = 0;
    local_288._8_8_ = 0;
    local_298._M_allocated_capacity = 0;
    local_298._8_8_ = (char *)0x0;
    local_268._8_8_ = 0;
    local_258._M_allocated_capacity = local_258._M_allocated_capacity & 0xffffffffffffff00;
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_248._8_8_ = 0;
    local_238._M_allocated_capacity = local_238._M_allocated_capacity & 0xffffffffffffff00;
    local_228._M_allocated_capacity = (size_type)&local_218;
    local_228._8_8_ = 0;
    local_218._M_allocated_capacity = local_218._M_allocated_capacity & 0xffffffffffffff00;
    local_208._M_allocated_capacity = (size_type)&local_1f8;
    local_208._8_8_ = 0;
    local_1f8._M_allocated_capacity = local_1f8._M_allocated_capacity & 0xffffffffffffff00;
    local_1e8._M_allocated_capacity = (size_type)&local_1d8;
    local_1e8._8_8_ = 0;
    local_1d8._M_allocated_capacity = local_1d8._M_allocated_capacity & 0xffffffffffffff00;
    local_1c8._8_8_ = 0;
    local_1b8._M_allocated_capacity = local_1b8._M_allocated_capacity & 0xffffffffffffff00;
    local_3a8 = 0x676e61682d6e63;
    uStack_3a1 = 0x7a;
    uStack_3a0 = 0x68;
    uStack_39f = 0x756f;
    local_3b0 = 0xb;
    local_39d = 0;
    local_398._48_8_ = 0x64697070615f796d;
    local_398._40_8_ = 8;
    local_398._56_2_ = local_398._56_2_ & 0xff00;
    local_328._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_328._M_local_buf[7] = 'e';
    local_328._M_local_buf[8] = 't';
    local_328._M_local_buf[9] = '\0';
    local_338._8_8_ = 9;
    local_3b8 = &local_3a8;
    local_398._32_8_ = pcVar1;
    local_338._M_allocated_capacity = (size_type)&local_328;
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_268._M_allocated_capacity = (size_type)paVar6;
    local_248._M_allocated_capacity = (size_type)proxy_host;
    local_1c8._M_allocated_capacity = (size_type)&local_1b8;
    proxy_host = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)aliyun::Slb::CreateSlbClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_allocated_capacity != &local_328) {
      operator_delete((void *)local_338._M_allocated_capacity,
                      CONCAT17(local_328._M_local_buf[7],local_328._M_allocated_capacity._0_7_) + 1)
      ;
    }
    if ((pointer)local_398._32_8_ != pcVar1) {
      operator_delete((void *)local_398._32_8_,local_398._48_8_ + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,CONCAT17(uStack_3a1,local_3a8) + 1);
    }
    if (proxy_host !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_00108bb8;
    aliyun::SlbDescribeLoadBalancerAttributeResponseType::
    ~SlbDescribeLoadBalancerAttributeResponseType
              ((SlbDescribeLoadBalancerAttributeResponseType *)&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_allocated_capacity != &local_2c8) {
      operator_delete((void *)local_2d8._M_allocated_capacity,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_allocated_capacity != &local_2e8) {
      operator_delete((void *)local_2f8._M_allocated_capacity,
                      CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT17(local_308._M_local_buf[7],
                               CONCAT61(local_308._M_allocated_capacity._1_6_,
                                        local_308._M_local_buf[0])) + 1);
    }
    local_298._8_8_ = local_288._M_local_buf + 8;
    local_288._M_allocated_capacity = 0;
    local_288._8_8_ = local_288._8_8_ & 0xffffffffffffff00;
    pcStack_270 = local_268._M_local_buf + 8;
    local_268._M_allocated_capacity = 0;
    local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
    local_258._8_8_ = local_248._M_local_buf + 8;
    local_248._M_allocated_capacity = 0;
    local_248._8_8_ = local_248._8_8_ & 0xffffffffffffff00;
    local_238._8_8_ = local_228._M_local_buf + 8;
    local_228._M_allocated_capacity = 0;
    local_228._8_8_ = local_228._8_8_ & 0xffffffffffffff00;
    local_218._8_8_ = local_208._M_local_buf + 8;
    local_208._M_allocated_capacity = 0;
    local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
    local_1e8._M_allocated_capacity = (size_type)&local_1d8;
    local_1e8._8_8_ = 0;
    local_1d8._M_allocated_capacity = local_1d8._M_allocated_capacity & 0xffffffffffffff00;
    local_1c8._8_8_ = 0;
    local_1b8._M_allocated_capacity = local_1b8._M_allocated_capacity & 0xffffffffffffff00;
    local_1a8._M_allocated_capacity = (size_type)&local_198;
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b8._8_8_ = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_1a8._8_8_ = 0;
    local_198._M_allocated_capacity = local_198._M_allocated_capacity & 0xffffffffffffff00;
    local_188._M_allocated_capacity = (size_type)&local_178;
    local_188._8_8_ = 0;
    local_178._M_allocated_capacity = local_178._M_allocated_capacity & 0xffffffffffffff00;
    local_3a8 = 0x676e61682d6e63;
    uStack_3a1 = 0x7a;
    uStack_3a0 = 0x68;
    uStack_39f = 0x756f;
    local_3b0 = 0xb;
    local_39d = 0;
    local_398._48_8_ = 0x64697070615f796d;
    local_398._40_8_ = 8;
    local_398._56_2_ = local_398._56_2_ & 0xff00;
    local_328._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_328._M_local_buf[7] = 'e';
    local_328._M_local_buf[8] = 't';
    local_328._M_local_buf[9] = '\0';
    local_338._8_8_ = 9;
    local_3b8 = &local_3a8;
    local_398._32_8_ = pcVar1;
    local_338._M_allocated_capacity = (size_type)&local_328;
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_2b8._M_allocated_capacity = (size_type)&local_2a8;
    local_1c8._M_allocated_capacity = (size_type)&local_1b8;
    proxy_host = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)aliyun::Slb::CreateSlbClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_allocated_capacity != &local_328) {
      operator_delete((void *)local_338._M_allocated_capacity,
                      CONCAT17(local_328._M_local_buf[7],local_328._M_allocated_capacity._0_7_) + 1)
      ;
    }
    if ((pointer)local_398._32_8_ != pcVar1) {
      operator_delete((void *)local_398._32_8_,local_398._48_8_ + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,CONCAT17(uStack_3a1,local_3a8) + 1);
    }
    if (proxy_host !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_00108cee;
    aliyun::SlbDescribeLoadBalancerHTTPListenerAttributeResponseType::
    ~SlbDescribeLoadBalancerHTTPListenerAttributeResponseType
              ((SlbDescribeLoadBalancerHTTPListenerAttributeResponseType *)&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_allocated_capacity != &local_2a8) {
      operator_delete((void *)local_2b8._M_allocated_capacity,
                      CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_allocated_capacity != &local_2c8) {
      operator_delete((void *)local_2d8._M_allocated_capacity,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_allocated_capacity != &local_2e8) {
      operator_delete((void *)local_2f8._M_allocated_capacity,
                      CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT17(local_308._M_local_buf[7],
                               CONCAT61(local_308._M_allocated_capacity._1_6_,
                                        local_308._M_local_buf[0])) + 1);
    }
    local_298._8_8_ = (char *)0x0;
    local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
    local_278._M_p = (pointer)&local_268;
    pcStack_270 = (char *)0x0;
    local_268._M_allocated_capacity = local_268._M_allocated_capacity & 0xffffffffffffff00;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_258._8_8_ = (char *)0x0;
    local_248._M_allocated_capacity = local_248._M_allocated_capacity & 0xffffffffffffff00;
    local_238._M_allocated_capacity = (size_type)&local_228;
    local_238._8_8_ = (char *)0x0;
    local_228._M_allocated_capacity = local_228._M_allocated_capacity & 0xffffffffffffff00;
    local_358._16_8_ = (pointer)0x0;
    local_358._0_8_ = (pointer)0x0;
    local_358._8_8_ = (pointer)0x0;
    local_308._M_local_buf[0] = 'c';
    local_308._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_308._M_local_buf[7] = 'z';
    local_308._8_3_ = 0x756f68;
    local_318._8_8_ = 0xb;
    local_308._M_local_buf[0xb] = '\0';
    local_3a8 = 0x697070615f796d;
    uStack_3a1 = 100;
    local_3b0 = 8;
    uStack_3a0 = 0;
    local_398._48_8_ = 0x65726365735f796d;
    local_398._40_8_ = 9;
    local_398._56_2_ = 0x74;
    local_3b8 = &local_3a8;
    local_398._32_8_ = pcVar1;
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_298._M_allocated_capacity = (size_type)&local_288;
    pHVar7 = (HttpTestListener *)aliyun::Slb::CreateSlbClient();
    if ((pointer)local_398._32_8_ != pcVar1) {
      operator_delete((void *)local_398._32_8_,local_398._48_8_ + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,CONCAT17(uStack_3a1,local_3a8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT17(local_308._M_local_buf[7],
                               CONCAT61(local_308._M_allocated_capacity._1_6_,
                                        local_308._M_local_buf[0])) + 1);
    }
    proxy_host = &local_238;
    if (pHVar7 != (HttpTestListener *)0x0) goto LAB_00108e38;
    std::
    vector<aliyun::SlbDescribeLoadBalancersLoadBalancerType,_std::allocator<aliyun::SlbDescribeLoadBalancersLoadBalancerType>_>
    ::~vector((vector<aliyun::SlbDescribeLoadBalancersLoadBalancerType,_std::allocator<aliyun::SlbDescribeLoadBalancersLoadBalancerType>_>
               *)local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      (ulong)(local_248._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != &local_268) {
      operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_allocated_capacity != &local_288) {
      operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1);
    }
    local_318._8_8_ = 0;
    local_308._M_local_buf[0] = '\0';
    local_2f8._M_allocated_capacity = (size_type)&local_2e8;
    local_2f8._8_8_ = 0;
    local_2e8._M_local_buf[0] = '\0';
    local_2d8._M_allocated_capacity = (size_type)&local_2c8;
    local_2d8._8_8_ = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b8._8_8_ = 0;
    local_2a8._M_local_buf[0] = '\0';
    local_298._8_8_ = local_288._M_local_buf + 8;
    local_288._M_allocated_capacity = 0;
    local_288._8_8_ = local_288._8_8_ & 0xffffffffffffff00;
    pcStack_270 = local_268._M_local_buf + 8;
    local_268._M_allocated_capacity = 0;
    local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
    local_248._8_8_ = 0;
    local_238._M_allocated_capacity = local_238._M_allocated_capacity & 0xffffffffffffff00;
    local_3b8 = &local_3a8;
    local_3a8 = 0x676e61682d6e63;
    uStack_3a1 = 0x7a;
    uStack_3a0 = 0x68;
    uStack_39f = 0x756f;
    local_3b0 = 0xb;
    local_39d = 0;
    local_398._48_8_ = 0x64697070615f796d;
    local_398._40_8_ = 8;
    local_398._56_2_ = local_398._56_2_ & 0xff00;
    local_328._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_328._M_local_buf[7] = 'e';
    local_328._M_local_buf[8] = 't';
    local_338._8_8_ = 9;
    local_328._M_local_buf[9] = '\0';
    local_398._32_8_ = pcVar1;
    local_338._M_allocated_capacity = (size_type)&local_328;
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_2b8._M_allocated_capacity = (size_type)&local_2a8;
    local_248._M_allocated_capacity = (size_type)proxy_host;
    pHVar7 = (HttpTestListener *)aliyun::Slb::CreateSlbClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_allocated_capacity != &local_328) {
      operator_delete((void *)local_338._M_allocated_capacity,
                      CONCAT17(local_328._M_local_buf[7],local_328._M_allocated_capacity._0_7_) + 1)
      ;
    }
    if ((pointer)local_398._32_8_ != pcVar1) {
      operator_delete((void *)local_398._32_8_,local_398._48_8_ + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,CONCAT17(uStack_3a1,local_3a8) + 1);
    }
    if (pHVar7 != (HttpTestListener *)0x0) goto LAB_00108f83;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_allocated_capacity != proxy_host) {
      operator_delete((void *)local_248._M_allocated_capacity,local_238._M_allocated_capacity + 1);
    }
    if (pcStack_270 != local_268._M_local_buf + 8) {
      operator_delete(pcStack_270,local_268._8_8_ + 1);
    }
    if ((char *)local_298._8_8_ != local_288._M_local_buf + 8) {
      operator_delete((void *)local_298._8_8_,local_288._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_allocated_capacity != &local_2a8) {
      operator_delete((void *)local_2b8._M_allocated_capacity,
                      CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1)
      ;
    }
    paVar6 = &local_328;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_allocated_capacity != &local_2c8) {
      operator_delete((void *)local_2d8._M_allocated_capacity,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_allocated_capacity != &local_2e8) {
      operator_delete((void *)local_2f8._M_allocated_capacity,
                      CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT17(local_308._M_local_buf[7],
                               CONCAT61(local_308._M_allocated_capacity._1_6_,
                                        local_308._M_local_buf[0])) + 1);
    }
    local_298._8_8_ = (char *)0x0;
    local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
    local_278._M_p = (pointer)&local_268;
    pcStack_270 = (char *)0x0;
    local_268._M_allocated_capacity = local_268._M_allocated_capacity & 0xffffffffffffff00;
    local_358._16_8_ = (pointer)0x0;
    local_358._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_358._8_8_ = (pointer)0x0;
    local_308._M_local_buf[0] = 'c';
    local_308._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_308._M_local_buf[7] = 'z';
    local_308._8_3_ = 0x756f68;
    local_318._8_8_ = 0xb;
    local_308._M_local_buf[0xb] = '\0';
    local_3a8 = 0x697070615f796d;
    uStack_3a1 = 100;
    local_3b0 = 8;
    uStack_3a0 = 0;
    local_398._48_8_ = 0x65726365735f796d;
    local_398._40_8_ = 9;
    local_398._56_2_ = 0x74;
    local_3b8 = &local_3a8;
    local_398._32_8_ = pcVar1;
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_298._M_allocated_capacity = (size_type)&local_288;
    proxy_host_00 =
         (SlbSetLoadBalancerHTTPListenerAttributeRequestType *)aliyun::Slb::CreateSlbClient();
    if ((pointer)local_398._32_8_ != pcVar1) {
      operator_delete((void *)local_398._32_8_,local_398._48_8_ + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,CONCAT17(uStack_3a1,local_3a8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT17(local_308._M_local_buf[7],
                               CONCAT61(local_308._M_allocated_capacity._1_6_,
                                        local_308._M_local_buf[0])) + 1);
    }
    if (proxy_host_00 != (SlbSetLoadBalancerHTTPListenerAttributeRequestType *)0x0)
    goto LAB_001090d0;
    std::
    vector<aliyun::SlbDescribeRegionsRegionType,_std::allocator<aliyun::SlbDescribeRegionsRegionType>_>
    ::~vector((vector<aliyun::SlbDescribeRegionsRegionType,_std::allocator<aliyun::SlbDescribeRegionsRegionType>_>
               *)local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != &local_268) {
      operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_allocated_capacity != &local_288) {
      operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1);
    }
    local_298._8_8_ = (char *)0x0;
    local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
    local_278._M_p = (pointer)&local_268;
    pcStack_270 = (char *)0x0;
    local_268._M_allocated_capacity = local_268._M_allocated_capacity & 0xffffffffffffff00;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_258._8_8_ = (char *)0x0;
    local_248._M_allocated_capacity = local_248._M_allocated_capacity & 0xffffffffffffff00;
    local_238._M_allocated_capacity = (size_type)&local_228;
    local_238._8_8_ = (char *)0x0;
    local_228._M_allocated_capacity = local_228._M_allocated_capacity & 0xffffffffffffff00;
    local_308._M_local_buf[0] = '\0';
    local_308._M_allocated_capacity._1_6_ = 0;
    local_308._M_local_buf[7] = '\0';
    local_318._M_allocated_capacity = 0;
    local_318._8_8_ = 0;
    lVar3 = (long)&local_2f8 + 8;
    local_308._8_3_ = (undefined3)lVar3;
    local_308._M_local_buf[0xb] = (char)((ulong)lVar3 >> 0x18);
    local_308._12_4_ = (undefined4)((ulong)lVar3 >> 0x20);
    local_2f8._M_allocated_capacity = 0;
    local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
    local_3a8 = 0x676e61682d6e63;
    uStack_3a1 = 0x7a;
    uStack_3a0 = 0x68;
    uStack_39f = 0x756f;
    local_3b0 = 0xb;
    local_39d = 0;
    local_398._48_8_ = 0x64697070615f796d;
    local_398._40_8_ = 8;
    local_398._56_2_ = local_398._56_2_ & 0xff00;
    local_328._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_328._M_local_buf[7] = 'e';
    local_328._M_local_buf[8] = 't';
    local_338._8_8_ = 9;
    local_328._M_local_buf[9] = '\0';
    local_3b8 = &local_3a8;
    local_398._32_8_ = pcVar1;
    local_338._M_allocated_capacity = (size_type)paVar6;
    local_298._M_allocated_capacity = (size_type)&local_288;
    proxy_host_00 =
         (SlbSetLoadBalancerHTTPListenerAttributeRequestType *)aliyun::Slb::CreateSlbClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_allocated_capacity != paVar6) {
      operator_delete((void *)local_338._M_allocated_capacity,
                      CONCAT17(local_328._M_local_buf[7],local_328._M_allocated_capacity._0_7_) + 1)
      ;
    }
    if ((pointer)local_398._32_8_ != pcVar1) {
      operator_delete((void *)local_398._32_8_,local_398._48_8_ + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,CONCAT17(uStack_3a1,local_3a8) + 1);
    }
    if (proxy_host_00 != (SlbSetLoadBalancerHTTPListenerAttributeRequestType *)0x0)
    goto LAB_001091ea;
    pcVar5 = (char *)CONCAT44(local_308._12_4_,CONCAT13(local_308._M_local_buf[0xb],local_308._8_3_)
                             );
    if (pcVar5 != local_2f8._M_local_buf + 8) {
      operator_delete(pcVar5,local_2f8._8_8_ + 1);
    }
    std::
    vector<aliyun::SlbRemoveBackendServersBackendServerType,_std::allocator<aliyun::SlbRemoveBackendServersBackendServerType>_>
    ::~vector((vector<aliyun::SlbRemoveBackendServersBackendServerType,_std::allocator<aliyun::SlbRemoveBackendServersBackendServerType>_>
               *)&local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      (ulong)(local_248._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != &local_268) {
      operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_allocated_capacity != &local_288) {
      operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1);
    }
    local_298._8_8_ = (char *)0x0;
    local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
    local_278._M_p = (pointer)&local_268;
    pcStack_270 = (char *)0x0;
    local_268._M_allocated_capacity = local_268._M_allocated_capacity & 0xffffffffffffff00;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_258._8_8_ = (char *)0x0;
    local_248._M_allocated_capacity = local_248._M_allocated_capacity & 0xffffffffffffff00;
    local_238._M_allocated_capacity = (size_type)&local_228;
    local_238._8_8_ = (char *)0x0;
    local_228._M_allocated_capacity = local_228._M_allocated_capacity & 0xffffffffffffff00;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_218._8_8_ = (char *)0x0;
    local_208._M_allocated_capacity = local_208._M_allocated_capacity & 0xffffffffffffff00;
    local_1f8._M_allocated_capacity = (size_type)&local_1e8;
    local_1f8._8_8_ = 0;
    local_1e8._M_allocated_capacity = local_1e8._M_allocated_capacity & 0xffffffffffffff00;
    local_1d8._M_allocated_capacity = (size_type)&local_1c8;
    local_1d8._8_8_ = 0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._M_allocated_capacity = (size_type)&local_1a8;
    local_1b8._8_8_ = 0;
    local_1a8._M_allocated_capacity = local_1a8._M_allocated_capacity & 0xffffffffffffff00;
    local_198._M_allocated_capacity = (size_type)&local_188;
    local_198._8_8_ = 0;
    local_188._M_allocated_capacity = local_188._M_allocated_capacity & 0xffffffffffffff00;
    local_178._M_allocated_capacity = (size_type)&local_168;
    local_178._8_8_ = 0;
    local_168._M_local_buf[0] = '\0';
    local_158._M_allocated_capacity = (size_type)&local_148;
    local_158._8_8_ = 0;
    local_148._M_local_buf[0] = '\0';
    local_138._M_allocated_capacity = (size_type)&local_128;
    local_138._8_8_ = 0;
    local_128._M_local_buf[0] = '\0';
    local_118._M_allocated_capacity = (size_type)&local_108;
    local_118._8_8_ = 0;
    local_108._M_local_buf[0] = '\0';
    local_f8 = &local_e8;
    local_f0 = 0;
    local_e8._M_local_buf[0] = '\0';
    local_d8 = &local_c8;
    local_d0 = 0;
    local_c8._M_local_buf[0] = '\0';
    local_b8 = &local_a8;
    local_b0 = 0;
    local_a8._M_local_buf[0] = '\0';
    local_98 = &local_88;
    local_90 = 0;
    local_88._M_local_buf[0] = '\0';
    local_308._M_local_buf[0] = 'c';
    local_308._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_308._M_local_buf[7] = 'z';
    local_308._8_3_ = 0x756f68;
    local_318._8_8_ = 0xb;
    local_308._M_local_buf[0xb] = '\0';
    local_3a8 = 0x697070615f796d;
    uStack_3a1 = 100;
    local_3b0 = 8;
    uStack_3a0 = 0;
    local_398._48_8_ = 0x65726365735f796d;
    local_398._56_2_ = 0x74;
    local_398._40_8_ = 9;
    local_3b8 = &local_3a8;
    local_398._32_8_ = pcVar1;
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_298._M_allocated_capacity = (size_type)&local_288;
    proxy_host_00 =
         (SlbSetLoadBalancerHTTPListenerAttributeRequestType *)aliyun::Slb::CreateSlbClient();
    if ((pointer)local_398._32_8_ != pcVar1) {
      operator_delete((void *)local_398._32_8_,local_398._48_8_ + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,CONCAT17(uStack_3a1,local_3a8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT17(local_308._M_local_buf[7],
                               CONCAT61(local_308._M_allocated_capacity._1_6_,
                                        local_308._M_local_buf[0])) + 1);
    }
    if (proxy_host_00 != (SlbSetLoadBalancerHTTPListenerAttributeRequestType *)0x0)
    goto LAB_00109334;
    aliyun::SlbSetLoadBalancerHTTPListenerAttributeRequestType::
    ~SlbSetLoadBalancerHTTPListenerAttributeRequestType
              ((SlbSetLoadBalancerHTTPListenerAttributeRequestType *)&local_298);
    local_298._8_8_ = (char *)0x0;
    local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
    local_278._M_p = (pointer)&local_268;
    pcStack_270 = (char *)0x0;
    local_268._M_allocated_capacity = local_268._M_allocated_capacity & 0xffffffffffffff00;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_258._8_8_ = (char *)0x0;
    local_248._M_allocated_capacity = local_248._M_allocated_capacity & 0xffffffffffffff00;
    local_238._M_allocated_capacity = (size_type)&local_228;
    local_238._8_8_ = (char *)0x0;
    local_228._M_allocated_capacity = local_228._M_allocated_capacity & 0xffffffffffffff00;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_218._8_8_ = (char *)0x0;
    local_208._M_allocated_capacity = local_208._M_allocated_capacity & 0xffffffffffffff00;
    local_308._M_local_buf[0] = 'c';
    local_308._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_308._M_local_buf[7] = 'z';
    local_308._8_3_ = 0x756f68;
    local_318._8_8_ = 0xb;
    local_308._M_local_buf[0xb] = '\0';
    local_3a8 = 0x697070615f796d;
    uStack_3a1 = 100;
    local_3b0 = 8;
    uStack_3a0 = 0;
    local_398._48_8_ = 0x65726365735f796d;
    local_398._40_8_ = 9;
    local_398._56_2_ = 0x74;
    local_3b8 = &local_3a8;
    local_398._32_8_ = pcVar1;
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_298._M_allocated_capacity = (size_type)&local_288;
    proxy_host_00 =
         (SlbSetLoadBalancerHTTPListenerAttributeRequestType *)aliyun::Slb::CreateSlbClient();
    if ((pointer)local_398._32_8_ != pcVar1) {
      operator_delete((void *)local_398._32_8_,local_398._48_8_ + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,CONCAT17(uStack_3a1,local_3a8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT17(local_308._M_local_buf[7],
                               CONCAT61(local_308._M_allocated_capacity._1_6_,
                                        local_308._M_local_buf[0])) + 1);
    }
    if (proxy_host_00 != (SlbSetLoadBalancerHTTPListenerAttributeRequestType *)0x0)
    goto LAB_00109575;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,local_208._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      (ulong)(local_248._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != &local_268) {
      operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_allocated_capacity != &local_288) {
      operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1);
    }
    local_298._8_8_ = (char *)0x0;
    local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
    local_278._M_p = (pointer)&local_268;
    pcStack_270 = (char *)0x0;
    local_268._M_allocated_capacity = local_268._M_allocated_capacity & 0xffffffffffffff00;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_258._8_8_ = (char *)0x0;
    local_248._M_allocated_capacity = local_248._M_allocated_capacity & 0xffffffffffffff00;
    local_238._M_allocated_capacity = (size_type)&local_228;
    local_238._8_8_ = (char *)0x0;
    local_228._M_allocated_capacity = local_228._M_allocated_capacity & 0xffffffffffffff00;
    local_308._M_local_buf[0] = 'c';
    local_308._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_308._M_local_buf[7] = 'z';
    local_308._8_3_ = 0x756f68;
    local_318._8_8_ = 0xb;
    local_308._M_local_buf[0xb] = '\0';
    local_3a8 = 0x697070615f796d;
    uStack_3a1 = 100;
    local_3b0 = 8;
    uStack_3a0 = 0;
    local_398._48_8_ = 0x65726365735f796d;
    local_398._40_8_ = 9;
    local_398._56_2_ = 0x74;
    local_3b8 = &local_3a8;
    local_398._32_8_ = pcVar1;
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_298._M_allocated_capacity = (size_type)&local_288;
    proxy_host_00 =
         (SlbSetLoadBalancerHTTPListenerAttributeRequestType *)aliyun::Slb::CreateSlbClient();
    if ((pointer)local_398._32_8_ != pcVar1) {
      operator_delete((void *)local_398._32_8_,local_398._48_8_ + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,CONCAT17(uStack_3a1,local_3a8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT17(local_308._M_local_buf[7],
                               CONCAT61(local_308._M_allocated_capacity._1_6_,
                                        local_308._M_local_buf[0])) + 1);
    }
    if (proxy_host_00 != (SlbSetLoadBalancerHTTPListenerAttributeRequestType *)0x0)
    goto LAB_001096c6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      (ulong)(local_248._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != &local_268) {
      operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_allocated_capacity != &local_288) {
      operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1);
    }
    local_298._8_8_ = (char *)0x0;
    local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
    local_278._M_p = (pointer)&local_268;
    pcStack_270 = (char *)0x0;
    local_268._M_allocated_capacity = local_268._M_allocated_capacity & 0xffffffffffffff00;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_258._8_8_ = (char *)0x0;
    local_248._M_allocated_capacity = local_248._M_allocated_capacity & 0xffffffffffffff00;
    local_238._M_allocated_capacity = (size_type)&local_228;
    local_238._8_8_ = (char *)0x0;
    local_228._M_allocated_capacity = local_228._M_allocated_capacity & 0xffffffffffffff00;
    local_308._M_local_buf[0] = 'c';
    local_308._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_308._M_local_buf[7] = 'z';
    local_308._8_3_ = 0x756f68;
    local_318._8_8_ = 0xb;
    local_308._M_local_buf[0xb] = '\0';
    local_3a8 = 0x697070615f796d;
    uStack_3a1 = 100;
    local_3b0 = 8;
    uStack_3a0 = 0;
    local_398._48_8_ = 0x65726365735f796d;
    local_398._40_8_ = 9;
    local_398._56_2_ = 0x74;
    local_3b8 = &local_3a8;
    local_398._32_8_ = pcVar1;
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_298._M_allocated_capacity = (size_type)&local_288;
    proxy_host_00 =
         (SlbSetLoadBalancerHTTPListenerAttributeRequestType *)aliyun::Slb::CreateSlbClient();
    if ((pointer)local_398._32_8_ != pcVar1) {
      operator_delete((void *)local_398._32_8_,local_398._48_8_ + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,CONCAT17(uStack_3a1,local_3a8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT17(local_308._M_local_buf[7],
                               CONCAT61(local_308._M_allocated_capacity._1_6_,
                                        local_308._M_local_buf[0])) + 1);
    }
    if (proxy_host_00 != (SlbSetLoadBalancerHTTPListenerAttributeRequestType *)0x0)
    goto LAB_00109803;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_allocated_capacity != &local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_allocated_capacity != &local_248) {
      operator_delete((void *)local_258._M_allocated_capacity,
                      (ulong)(local_248._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != &local_268) {
      operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_allocated_capacity != &local_288) {
      operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1);
    }
    local_298._8_8_ = (char *)0x0;
    local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
    local_278._M_p = (pointer)&local_268;
    pcStack_270 = (char *)0x0;
    local_268._M_allocated_capacity = local_268._M_allocated_capacity & 0xffffffffffffff00;
    local_258._M_allocated_capacity = (size_type)&local_248;
    local_258._8_8_ = (char *)0x0;
    local_248._M_allocated_capacity = local_248._M_allocated_capacity & 0xffffffffffffff00;
    local_238._M_allocated_capacity = (size_type)&local_228;
    local_238._8_8_ = (char *)0x0;
    local_228._M_allocated_capacity = local_228._M_allocated_capacity & 0xffffffffffffff00;
    local_218._M_allocated_capacity = (size_type)&local_208;
    local_218._8_8_ = (char *)0x0;
    local_208._M_allocated_capacity = local_208._M_allocated_capacity & 0xffffffffffffff00;
    local_1f8._M_allocated_capacity = (size_type)&local_1e8;
    local_1f8._8_8_ = 0;
    local_1e8._M_allocated_capacity = local_1e8._M_allocated_capacity & 0xffffffffffffff00;
    local_1d8._M_allocated_capacity = (size_type)&local_1c8;
    local_1d8._8_8_ = 0;
    local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._M_allocated_capacity = (size_type)&local_1a8;
    local_1b8._8_8_ = 0;
    local_1a8._M_allocated_capacity = local_1a8._M_allocated_capacity & 0xffffffffffffff00;
    local_198._M_allocated_capacity = (size_type)&local_188;
    local_198._8_8_ = 0;
    local_188._M_allocated_capacity = local_188._M_allocated_capacity & 0xffffffffffffff00;
    local_178._M_allocated_capacity = (size_type)&local_168;
    local_178._8_8_ = 0;
    local_168._M_local_buf[0] = '\0';
    local_158._M_allocated_capacity = (size_type)&local_148;
    local_158._8_8_ = 0;
    local_148._M_local_buf[0] = '\0';
    local_138._M_allocated_capacity = (size_type)&local_128;
    local_138._8_8_ = 0;
    local_128._M_local_buf[0] = '\0';
    local_308._M_local_buf[0] = 'c';
    local_308._M_allocated_capacity._1_6_ = 0x676e61682d6e;
    local_308._M_local_buf[7] = 'z';
    local_308._8_3_ = 0x756f68;
    local_318._8_8_ = 0xb;
    local_308._M_local_buf[0xb] = '\0';
    local_3a8 = 0x697070615f796d;
    uStack_3a1 = 100;
    local_3b0 = 8;
    uStack_3a0 = 0;
    local_398._48_8_ = 0x65726365735f796d;
    local_398._56_2_ = 0x74;
    local_398._40_8_ = 9;
    local_3b8 = &local_3a8;
    local_398._32_8_ = pcVar1;
    local_318._M_allocated_capacity = (size_type)&local_308;
    local_298._M_allocated_capacity = (size_type)&local_288;
    proxy_host_00 =
         (SlbSetLoadBalancerHTTPListenerAttributeRequestType *)aliyun::Slb::CreateSlbClient();
    if ((pointer)local_398._32_8_ != pcVar1) {
      operator_delete((void *)local_398._32_8_,local_398._48_8_ + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,CONCAT17(uStack_3a1,local_3a8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_allocated_capacity != &local_308) {
      operator_delete((void *)local_318._M_allocated_capacity,
                      CONCAT17(local_308._M_local_buf[7],
                               CONCAT61(local_308._M_allocated_capacity._1_6_,
                                        local_308._M_local_buf[0])) + 1);
    }
    if (proxy_host_00 == (SlbSetLoadBalancerHTTPListenerAttributeRequestType *)0x0) {
      aliyun::SlbSetLoadBalancerTCPListenerAttributeRequestType::
      ~SlbSetLoadBalancerTCPListenerAttributeRequestType
                ((SlbSetLoadBalancerTCPListenerAttributeRequestType *)&local_298);
      local_298._8_8_ = (char *)0x0;
      local_288._M_allocated_capacity = local_288._M_allocated_capacity & 0xffffffffffffff00;
      local_278._M_p = (pointer)&local_268;
      pcStack_270 = (char *)0x0;
      local_268._M_allocated_capacity = local_268._M_allocated_capacity & 0xffffffffffffff00;
      local_258._M_allocated_capacity = (size_type)&local_248;
      local_258._8_8_ = (char *)0x0;
      local_248._M_allocated_capacity = local_248._M_allocated_capacity & 0xffffffffffffff00;
      local_238._M_allocated_capacity = (size_type)&local_228;
      local_238._8_8_ = (char *)0x0;
      local_228._M_allocated_capacity = local_228._M_allocated_capacity & 0xffffffffffffff00;
      local_218._M_allocated_capacity = (size_type)&local_208;
      local_218._8_8_ = (char *)0x0;
      local_208._M_allocated_capacity = local_208._M_allocated_capacity & 0xffffffffffffff00;
      local_308._M_local_buf[0] = 'c';
      local_308._M_allocated_capacity._1_6_ = 0x676e61682d6e;
      local_308._M_local_buf[7] = 'z';
      local_308._8_3_ = 0x756f68;
      local_318._8_8_ = 0xb;
      local_308._M_local_buf[0xb] = '\0';
      local_3a8 = 0x697070615f796d;
      uStack_3a1 = 100;
      local_3b0 = 8;
      uStack_3a0 = 0;
      local_398._48_8_ = 0x65726365735f796d;
      local_398._40_8_ = 9;
      local_398._56_2_ = 0x74;
      local_3b8 = &local_3a8;
      local_398._32_8_ = pcVar1;
      local_318._M_allocated_capacity = (size_type)&local_308;
      local_298._M_allocated_capacity = (size_type)&local_288;
      proxy_host_00 =
           (SlbSetLoadBalancerHTTPListenerAttributeRequestType *)aliyun::Slb::CreateSlbClient();
      if ((pointer)local_398._32_8_ != pcVar1) {
        operator_delete((void *)local_398._32_8_,local_398._48_8_ + 1);
      }
      if (local_3b8 != &local_3a8) {
        operator_delete(local_3b8,CONCAT17(uStack_3a1,local_3a8) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_allocated_capacity != &local_308) {
        operator_delete((void *)local_318._M_allocated_capacity,
                        CONCAT17(local_308._M_local_buf[7],
                                 CONCAT61(local_308._M_allocated_capacity._1_6_,
                                          local_308._M_local_buf[0])) + 1);
      }
      if (proxy_host_00 == (SlbSetLoadBalancerHTTPListenerAttributeRequestType *)0x0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_allocated_capacity != &local_208) {
          operator_delete((void *)local_218._M_allocated_capacity,
                          local_208._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_allocated_capacity != &local_228) {
          operator_delete((void *)local_238._M_allocated_capacity,
                          local_228._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_allocated_capacity != &local_248) {
          operator_delete((void *)local_258._M_allocated_capacity,
                          (ulong)(local_248._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_p != &local_268) {
          operator_delete(local_278._M_p,local_268._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_allocated_capacity != &local_288) {
          operator_delete((void *)local_298._M_allocated_capacity,
                          local_288._M_allocated_capacity + 1);
        }
        return 0;
      }
      goto LAB_00109b1d;
    }
  }
  else {
    local_398._16_2_ = 0x3231;
    local_398[0x12] = '7';
    local_398._19_4_ = 0x302e302e;
    local_398[0x17] = '.';
    local_398._24_7_ = 0x34333232313a31;
    local_398._8_8_ = 0xf;
    local_398[0x1f] = '\0';
    local_398._0_8_ = local_398 + 0x10;
    aliyun::Slb::SetProxyHost((Slb *)this,(string *)local_398);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,
                      CONCAT17(local_398[0x17],
                               CONCAT43(local_398._19_4_,CONCAT12(local_398[0x12],local_398._16_2_))
                              ) + 1);
    }
    if ((char)(this->listener_port)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->listener_port)._M_string_length + 1) = 0;
    }
    pHVar7 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar7,0x2fca);
    local_358._0_8_ = (pointer)(local_358 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,
               "{  \"BackendServers\": {    \"BackendServer\": [      {        \"ServerId\": \"ServerId\",        \"Weight\": 0      }    ]  },  \"LoadBalancerId\": \"LoadBalancerId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar7,(string *)local_358);
    if ((pointer)local_358._0_8_ != (pointer)(local_358 + 0x10)) {
      operator_delete((void *)local_358._0_8_,(ulong)(local_358._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar7);
    std::__cxx11::string::operator=((string *)local_298._M_local_buf,"LoadBalancerId");
    std::__cxx11::string::operator=((string *)&local_278,"BackendServers");
    std::__cxx11::string::operator=((string *)local_258._M_local_buf,"HostId");
    std::__cxx11::string::operator=((string *)local_238._M_local_buf,"OwnerAccount");
    aliyun::Slb::AddBackendServers
              ((SlbAddBackendServersRequestType *)this,
               (SlbAddBackendServersResponseType *)&local_298,(SlbErrorInfo *)local_318._M_local_buf
              );
    HttpTestListener::WaitComplete(pHVar7);
    main_cold_1();
LAB_001081fc:
    local_398._16_2_ = 0x3231;
    local_398[0x12] = '7';
    local_398._19_4_ = 0x302e302e;
    local_398[0x17] = '.';
    local_398._24_7_ = 0x34333232313a31;
    local_398._8_8_ = 0xf;
    local_398[0x1f] = '\0';
    local_398._0_8_ = local_398 + 0x10;
    aliyun::Slb::SetProxyHost((Slb *)this,(string *)local_398);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,
                      CONCAT17(local_398[0x17],
                               CONCAT43(local_398._19_4_,CONCAT12(local_398[0x12],local_398._16_2_))
                              ) + 1);
    }
    if ((char)(this->listener_port)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->listener_port)._M_string_length + 1) = 0;
    }
    pHVar7 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar7,0x2fca);
    local_358._0_8_ = (pointer)(local_358 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,
               "{  \"Address\": \"Address\",  \"LoadBalancerId\": \"LoadBalancerId\",  \"LoadBalancerName\": \"LoadBalancerName\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar7,(string *)local_358);
    if ((pointer)local_358._0_8_ != (pointer)(local_358 + 0x10)) {
      operator_delete((void *)local_358._0_8_,(ulong)(local_358._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar7);
    std::__cxx11::string::operator=((string *)local_298._M_local_buf,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_278,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_258._M_local_buf,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_238._M_local_buf,"IsPublicAddress");
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"Address");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"ClientToken");
    std::__cxx11::string::operator=((string *)local_1d8._M_local_buf,"LoadBalancerName");
    std::__cxx11::string::operator=((string *)local_1b8._M_local_buf,"LoadBalancerMode");
    std::__cxx11::string::operator=((string *)local_198._M_local_buf,"OwnerAccount");
    aliyun::Slb::CreateLoadBalancer
              ((SlbCreateLoadBalancerRequestType *)this,
               (SlbCreateLoadBalancerResponseType *)&local_298,
               (SlbErrorInfo *)local_318._M_local_buf);
    HttpTestListener::WaitComplete(pHVar7);
    main_cold_2();
LAB_001083aa:
    local_328._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_328._M_local_buf[7] = '.';
    local_328._M_local_buf[8] = '1';
    local_328._M_local_buf[9] = ':';
    local_328._10_5_ = 0x3433323231;
    local_338._8_8_ = 0xf;
    local_328._M_local_buf[0xf] = '\0';
    local_338._M_allocated_capacity = (size_type)&local_328;
    aliyun::Slb::SetProxyHost((Slb *)this,(string *)&local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_allocated_capacity != &local_328) {
      operator_delete((void *)local_338._M_allocated_capacity,
                      CONCAT17(local_328._M_local_buf[7],local_328._M_allocated_capacity._0_7_) + 1)
      ;
    }
    if ((char)(this->listener_port)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->listener_port)._M_string_length + 1) = 0;
    }
    pHVar7 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar7,0x2fca);
    local_398._16_2_ = 0x7d7b;
    local_398._8_8_ = 2;
    local_398[0x12] = '\0';
    local_398._0_8_ = local_398 + 0x10;
    HttpTestListener::SetResponseBody(pHVar7,(string *)local_398);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,
                      CONCAT17(local_398[0x17],
                               CONCAT43(local_398._19_4_,CONCAT12(local_398[0x12],local_398._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar7);
    std::__cxx11::string::operator=((string *)local_298._M_local_buf,"LoadBalancerId");
    std::__cxx11::string::operator=((string *)&local_278,"ListenerPort");
    std::__cxx11::string::operator=((string *)local_258._M_local_buf,"BackendServerPort");
    std::__cxx11::string::operator=((string *)local_238._M_local_buf,"ListenerStatus");
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"XForwardedFor");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"Scheduler");
    std::__cxx11::string::operator=((string *)local_1d8._M_local_buf,"StickySession");
    std::__cxx11::string::operator=((string *)local_1b8._M_local_buf,"StickySessionType");
    std::__cxx11::string::operator=((string *)local_198._M_local_buf,"CookieTimeout");
    std::__cxx11::string::operator=((string *)local_178._M_local_buf,"Cookie");
    std::__cxx11::string::operator=((string *)local_158._M_local_buf,"HealthCheck");
    std::__cxx11::string::operator=((string *)local_138._M_local_buf,"Domain");
    std::__cxx11::string::operator=((string *)local_118._M_local_buf,"URI");
    std::__cxx11::string::operator=((string *)&local_f8,"HealthyThreshold");
    std::__cxx11::string::operator=((string *)&local_d8,"UnhealthyThreshold");
    std::__cxx11::string::operator=((string *)&local_b8,"HealthCheckTimeout");
    std::__cxx11::string::operator=((string *)&local_98,"Interval");
    std::__cxx11::string::operator=((string *)&local_78,"HostId");
    std::__cxx11::string::operator=((string *)&local_58,"OwnerAccount");
    aliyun::Slb::CreateLoadBalancerHTTPListener
              (this,(SlbCreateLoadBalancerHTTPListenerResponseType *)local_298._M_local_buf,
               (SlbErrorInfo *)local_358);
    HttpTestListener::WaitComplete(pHVar7);
    main_cold_3();
LAB_00108613:
    proxy_host = &local_338;
    local_328._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_328._M_local_buf[7] = '.';
    local_328._M_local_buf[8] = '1';
    local_328._M_local_buf[9] = ':';
    local_328._10_5_ = 0x3433323231;
    local_338._8_8_ = 0xf;
    local_328._M_local_buf[0xf] = '\0';
    local_338._M_allocated_capacity = (size_type)&local_328;
    aliyun::Slb::SetProxyHost((Slb *)paVar6->_M_local_buf,(string *)proxy_host);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_allocated_capacity != &local_328) {
      operator_delete((void *)local_338._M_allocated_capacity,
                      CONCAT17(local_328._M_local_buf[7],local_328._M_allocated_capacity._0_7_) + 1)
      ;
    }
    if (paVar6->_M_local_buf[0x28] == '\x01') {
      paVar6->_M_local_buf[0x29] = '\0';
    }
    pHVar7 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar7,0x2fca);
    local_398._16_2_ = 0x7d7b;
    local_398._8_8_ = 2;
    local_398[0x12] = '\0';
    local_398._0_8_ = local_398 + 0x10;
    HttpTestListener::SetResponseBody(pHVar7,(string *)local_398);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,
                      CONCAT17(local_398[0x17],
                               CONCAT43(local_398._19_4_,CONCAT12(local_398[0x12],local_398._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar7);
    std::__cxx11::string::operator=((string *)local_298._M_local_buf,"LoadBalancerId");
    std::__cxx11::string::operator=((string *)&local_278,"ListenerPort");
    std::__cxx11::string::operator=((string *)local_258._M_local_buf,"BackendServerPort");
    std::__cxx11::string::operator=((string *)local_238._M_local_buf,"ListenerStatus");
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"Scheduler");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"PersistenceTimeout");
    std::__cxx11::string::operator=((string *)local_1d8._M_local_buf,"HealthCheck");
    std::__cxx11::string::operator=((string *)local_1b8._M_local_buf,"ConnectTimeout");
    std::__cxx11::string::operator=((string *)local_198._M_local_buf,"ConnectPort");
    std::__cxx11::string::operator=((string *)local_178._M_local_buf,"Interval");
    std::__cxx11::string::operator=((string *)local_158._M_local_buf,"HostId");
    std::__cxx11::string::operator=((string *)local_138._M_local_buf,"OwnerAccount");
    aliyun::Slb::CreateLoadBalancerTCPListener
              ((SlbCreateLoadBalancerTCPListenerRequestType *)paVar6,
               (SlbCreateLoadBalancerTCPListenerResponseType *)local_298._M_local_buf,
               (SlbErrorInfo *)local_358);
    HttpTestListener::WaitComplete(pHVar7);
    main_cold_4();
LAB_001087ef:
    local_328._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_328._M_local_buf[7] = '.';
    local_328._M_local_buf[8] = '1';
    local_328._M_local_buf[9] = ':';
    local_328._10_5_ = 0x3433323231;
    local_338._8_8_ = 0xf;
    local_328._M_local_buf[0xf] = '\0';
    local_338._M_allocated_capacity = (size_type)&local_328;
    aliyun::Slb::SetProxyHost((Slb *)proxy_host->_M_local_buf,(string *)&local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_allocated_capacity != &local_328) {
      operator_delete((void *)local_338._M_allocated_capacity,
                      CONCAT17(local_328._M_local_buf[7],local_328._M_allocated_capacity._0_7_) + 1)
      ;
    }
    if ((char)*(size_type *)(proxy_host->_M_local_buf + 0x28) == '\x01') {
      proxy_host->_M_local_buf[0x29] = '\0';
    }
    pHVar7 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar7,0x2fca);
    local_398._16_2_ = 0x7d7b;
    local_398._8_8_ = 2;
    local_398[0x12] = '\0';
    local_398._0_8_ = local_398 + 0x10;
    HttpTestListener::SetResponseBody(pHVar7,(string *)local_398);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,
                      CONCAT17(local_398[0x17],
                               CONCAT43(local_398._19_4_,CONCAT12(local_398[0x12],local_398._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar7);
    std::__cxx11::string::operator=((string *)local_298._M_local_buf,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_278,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)local_258._M_local_buf,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)local_238._M_local_buf,"LoadBalancerId");
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"OwnerAccount");
    aliyun::Slb::DeleteLoadBalancer
              ((SlbDeleteLoadBalancerRequestType *)proxy_host,
               (SlbDeleteLoadBalancerResponseType *)local_298._M_local_buf,(SlbErrorInfo *)local_358
              );
    HttpTestListener::WaitComplete(pHVar7);
    main_cold_5();
LAB_00108940:
    local_328._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_328._M_local_buf[7] = '.';
    local_328._M_local_buf[8] = '1';
    local_328._M_local_buf[9] = ':';
    local_328._10_5_ = 0x3433323231;
    local_338._8_8_ = 0xf;
    local_328._M_local_buf[0xf] = '\0';
    local_338._M_allocated_capacity = (size_type)&local_328;
    aliyun::Slb::SetProxyHost((Slb *)proxy_host->_M_local_buf,(string *)&local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_allocated_capacity != &local_328) {
      operator_delete((void *)local_338._M_allocated_capacity,
                      CONCAT17(local_328._M_local_buf[7],local_328._M_allocated_capacity._0_7_) + 1)
      ;
    }
    if ((char)*(size_type *)(proxy_host->_M_local_buf + 0x28) == '\x01') {
      proxy_host->_M_local_buf[0x29] = '\0';
    }
    pHVar7 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar7,0x2fca);
    local_398._16_2_ = 0x7d7b;
    local_398._8_8_ = 2;
    local_398[0x12] = '\0';
    local_398._0_8_ = local_398 + 0x10;
    HttpTestListener::SetResponseBody(pHVar7,(string *)local_398);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,
                      CONCAT17(local_398[0x17],
                               CONCAT43(local_398._19_4_,CONCAT12(local_398[0x12],local_398._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar7);
    std::__cxx11::string::operator=((string *)local_298._M_local_buf,"LoadBalancerId");
    std::__cxx11::string::operator=((string *)&local_278,"ListenerPort");
    std::__cxx11::string::operator=((string *)local_258._M_local_buf,"HostId");
    std::__cxx11::string::operator=((string *)local_238._M_local_buf,"OwnerAccount");
    aliyun::Slb::DeleteLoadBalancerListener
              ((SlbDeleteLoadBalancerListenerRequestType *)proxy_host,
               (SlbDeleteLoadBalancerListenerResponseType *)local_298._M_local_buf,
               (SlbErrorInfo *)local_358);
    HttpTestListener::WaitComplete(pHVar7);
    main_cold_6();
LAB_00108a7d:
    local_328._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_328._M_local_buf[7] = '.';
    local_328._M_local_buf[8] = '1';
    local_328._M_local_buf[9] = ':';
    local_328._10_5_ = 0x3433323231;
    local_338._8_8_ = 0xf;
    local_328._M_local_buf[0xf] = '\0';
    local_338._M_allocated_capacity = (size_type)&local_328;
    aliyun::Slb::SetProxyHost((Slb *)pHVar7,(string *)&local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_allocated_capacity != &local_328) {
      operator_delete((void *)local_338._M_allocated_capacity,
                      CONCAT17(local_328._M_local_buf[7],local_328._M_allocated_capacity._0_7_) + 1)
      ;
    }
    if ((char)(pHVar7->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar7->request_url_)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_398._0_8_ = local_398 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_398,
               "{  \"Listeners\": {    \"Listener\": [      {        \"BackendServers\": {          \"BackendServer\": [            {              \"ServerId\": \"ServerId\",              \"ServerHealthStatus\": \"ServerHealthStatus\"            }          ]        },        \"ListenerPort\": 0      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar8,(string *)local_398);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,
                      CONCAT17(local_398[0x17],
                               CONCAT43(local_398._19_4_,CONCAT12(local_398[0x12],local_398._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_298._M_local_buf,"LoadBalancerId");
    std::__cxx11::string::operator=((string *)&local_278,"ListenerPort");
    std::__cxx11::string::operator=((string *)paVar6->_M_local_buf,"HostId");
    std::__cxx11::string::operator=((string *)proxy_host->_M_local_buf,"OwnerAccount");
    aliyun::Slb::DescribeBackendServers
              ((SlbDescribeBackendServersRequestType *)pHVar7,
               (SlbDescribeBackendServersResponseType *)&local_298,(SlbErrorInfo *)local_358);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_7();
LAB_00108bb8:
    local_398._16_2_ = 0x3231;
    local_398[0x12] = '7';
    local_398._19_4_ = 0x302e302e;
    local_398[0x17] = '.';
    local_398._24_7_ = 0x34333232313a31;
    local_398._8_8_ = 0xf;
    local_398[0x1f] = '\0';
    local_398._0_8_ = local_398 + 0x10;
    aliyun::Slb::SetProxyHost((Slb *)proxy_host->_M_local_buf,(string *)local_398);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,
                      CONCAT17(local_398[0x17],
                               CONCAT43(local_398._19_4_,CONCAT12(local_398[0x12],local_398._16_2_))
                              ) + 1);
    }
    if ((char)*(size_type *)(proxy_host->_M_local_buf + 0x28) == '\x01') {
      proxy_host->_M_local_buf[0x29] = '\0';
    }
    pHVar7 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar7,0x2fca);
    local_358._0_8_ = (pointer)(local_358 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,
               "{  \"BackendServers\": {    \"BackendServer\": [      {        \"ServerId\": \"ServerId\",        \"Weight\": 0      }    ]  },  \"ListenerPorts\": {    \"ListenerPort\": [      \"ListenerPort\"    ]  },  \"LoadBalancerId\": \"LoadBalancerId\",  \"LoadBalancerName\": \"LoadBalancerName\",  \"LoadBalancerStatus\": \"LoadBalancerStatus\",  \"RegionId\": \"RegionId\",  \"Address\": \"Address\",  \"IsPublicAddress\": \"IsPublicAddress\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar7,(string *)local_358);
    if ((pointer)local_358._0_8_ != (pointer)(local_358 + 0x10)) {
      operator_delete((void *)local_358._0_8_,(ulong)(local_358._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar7);
    std::__cxx11::string::operator=((string *)local_318._M_local_buf,"LoadBalancerId");
    std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"HostId");
    std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"OwnerAccount");
    aliyun::Slb::DescribeLoadBalancerAttribute
              ((SlbDescribeLoadBalancerAttributeRequestType *)proxy_host,
               (SlbDescribeLoadBalancerAttributeResponseType *)&local_318,
               (SlbErrorInfo *)local_298._M_local_buf);
    HttpTestListener::WaitComplete(pHVar7);
    main_cold_8();
LAB_00108cee:
    local_398._16_2_ = 0x3231;
    local_398[0x12] = '7';
    local_398._19_4_ = 0x302e302e;
    local_398[0x17] = '.';
    local_398._24_7_ = 0x34333232313a31;
    local_398._8_8_ = 0xf;
    local_398[0x1f] = '\0';
    local_398._0_8_ = local_398 + 0x10;
    aliyun::Slb::SetProxyHost((Slb *)proxy_host->_M_local_buf,(string *)local_398);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,
                      CONCAT17(local_398[0x17],
                               CONCAT43(local_398._19_4_,CONCAT12(local_398[0x12],local_398._16_2_))
                              ) + 1);
    }
    if ((char)*(size_type *)(proxy_host->_M_local_buf + 0x28) == '\x01') {
      proxy_host->_M_local_buf[0x29] = '\0';
    }
    pHVar7 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar7,0x2fca);
    local_358._0_8_ = (pointer)(local_358 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,
               "{  \"ListenerPort\": 0,  \"BackendServerPort\": 0,  \"Status\": \"Status\",  \"XForwardedFor\": \"XForwardedFor\",  \"Scheduler\": \"Scheduler\",  \"StickySession\": \"StickySession\",  \"StickySessionapiType\": \"StickySessionapiType\",  \"CookieTimeout\": 0,  \"Cookie\": \"Cookie\",  \"HealthCheck\": \"HealthCheck\",  \"Domain\": \"Domain\",  \"URI\": \"URI\",  \"HealthyThreshold\": 0,  \"UnhealthyThreshold\": 0,  \"HealthCheckTimeout\": 0,  \"Interval\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar7,(string *)local_358);
    if ((pointer)local_358._0_8_ != (pointer)(local_358 + 0x10)) {
      operator_delete((void *)local_358._0_8_,(ulong)(local_358._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar7);
    std::__cxx11::string::operator=((string *)local_318._M_local_buf,"LoadBalancerId");
    std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ListenerPort");
    std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"HostId");
    std::__cxx11::string::operator=((string *)local_2b8._M_local_buf,"OwnerAccount");
    aliyun::Slb::DescribeLoadBalancerHTTPListenerAttribute
              ((SlbDescribeLoadBalancerHTTPListenerAttributeRequestType *)proxy_host,
               (SlbDescribeLoadBalancerHTTPListenerAttributeResponseType *)&local_318,
               (SlbErrorInfo *)local_298._M_local_buf);
    HttpTestListener::WaitComplete(pHVar7);
    main_cold_9();
LAB_00108e38:
    local_328._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_328._M_local_buf[7] = '.';
    local_328._M_local_buf[8] = '1';
    local_328._M_local_buf[9] = ':';
    local_328._10_5_ = 0x3433323231;
    local_338._8_8_ = 0xf;
    local_328._M_local_buf[0xf] = '\0';
    local_338._M_allocated_capacity = (size_type)&local_328;
    aliyun::Slb::SetProxyHost((Slb *)pHVar7,(string *)&local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_allocated_capacity != &local_328) {
      operator_delete((void *)local_338._M_allocated_capacity,
                      CONCAT17(local_328._M_local_buf[7],local_328._M_allocated_capacity._0_7_) + 1)
      ;
    }
    if ((char)(pHVar7->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar7->request_url_)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    local_398._0_8_ = local_398 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_398,
               "{  \"LoadBalancers\": {    \"LoadBalancer\": [      {        \"LoadBalancerId\": \"LoadBalancerId\",        \"LoadBalancerName\": \"LoadBalancerName\",        \"LoadBalancerStatus\": \"LoadBalancerStatus\"      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar8,(string *)local_398);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,
                      CONCAT17(local_398[0x17],
                               CONCAT43(local_398._19_4_,CONCAT12(local_398[0x12],local_398._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_298._M_local_buf,"ServerId");
    std::__cxx11::string::operator=((string *)&local_278,"LoadBalancerId");
    std::__cxx11::string::operator=((string *)local_258._M_local_buf,"HostId");
    std::__cxx11::string::operator=((string *)proxy_host->_M_local_buf,"OwnerAccount");
    aliyun::Slb::DescribeLoadBalancers
              ((SlbDescribeLoadBalancersRequestType *)pHVar7,
               (SlbDescribeLoadBalancersResponseType *)&local_298,(SlbErrorInfo *)local_358);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_10();
LAB_00108f83:
    local_398._16_2_ = 0x3231;
    local_398[0x12] = '7';
    local_398._19_4_ = 0x302e302e;
    local_398[0x17] = '.';
    local_398._24_7_ = 0x34333232313a31;
    local_398._8_8_ = 0xf;
    local_398[0x1f] = '\0';
    proxy_host_00 = (SlbSetLoadBalancerHTTPListenerAttributeRequestType *)local_398;
    local_398._0_8_ = local_398 + 0x10;
    aliyun::Slb::SetProxyHost((Slb *)pHVar7,(string *)proxy_host_00);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,
                      CONCAT17(local_398[0x17],
                               CONCAT43(local_398._19_4_,CONCAT12(local_398[0x12],local_398._16_2_))
                              ) + 1);
    }
    if ((char)(pHVar7->request_url_)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(pHVar7->request_url_)._M_string_length + 1) = 0;
    }
    pHVar8 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar8,0x2fca);
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_358 + 0x10);
    local_358._0_8_ = paVar6;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,
               "{  \"ListenerPort\": 0,  \"BackendServerPort\": 0,  \"Status\": \"Status\",  \"Scheduler\": \"Scheduler\",  \"PersistenceTimeout\": 0,  \"HealthCheck\": \"HealthCheck\",  \"HealthyThreshold\": 0,  \"UnhealthyThreshold\": 0,  \"ConnectTimeout\": 0,  \"ConnectPort\": 0,  \"Interval\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar8,(string *)local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._0_8_ != paVar6) {
      operator_delete((void *)local_358._0_8_,(ulong)(local_358._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar8);
    std::__cxx11::string::operator=((string *)local_318._M_local_buf,"LoadBalancerId");
    std::__cxx11::string::operator=((string *)local_2f8._M_local_buf,"ListenerPort");
    std::__cxx11::string::operator=((string *)local_2d8._M_local_buf,"HostId");
    std::__cxx11::string::operator=((string *)local_2b8._M_local_buf,"OwnerAccount");
    aliyun::Slb::DescribeLoadBalancerTCPListenerAttribute
              ((SlbDescribeLoadBalancerTCPListenerAttributeRequestType *)pHVar7,
               (SlbDescribeLoadBalancerTCPListenerAttributeResponseType *)&local_318,
               (SlbErrorInfo *)local_298._M_local_buf);
    HttpTestListener::WaitComplete(pHVar8);
    main_cold_11();
LAB_001090d0:
    local_328._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_328._M_local_buf[7] = '.';
    local_328._M_local_buf[8] = '1';
    local_328._M_local_buf[9] = ':';
    local_328._10_5_ = 0x3433323231;
    local_338._8_8_ = 0xf;
    local_328._M_local_buf[0xf] = '\0';
    local_338._M_allocated_capacity = (size_type)paVar6;
    aliyun::Slb::SetProxyHost((Slb *)proxy_host_00,(string *)&local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_allocated_capacity != paVar6) {
      operator_delete((void *)local_338._M_allocated_capacity,
                      CONCAT17(local_328._M_local_buf[7],local_328._M_allocated_capacity._0_7_) + 1)
      ;
    }
    if ((char)(proxy_host_00->listener_port)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(proxy_host_00->listener_port)._M_string_length + 1) = 0;
    }
    pHVar7 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar7,0x2fca);
    local_398._0_8_ = local_398 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_398,
               "{  \"Regions\": {    \"Region\": [      {        \"RegionId\": \"RegionId\"      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar7,(string *)local_398);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,
                      CONCAT17(local_398[0x17],
                               CONCAT43(local_398._19_4_,CONCAT12(local_398[0x12],local_398._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar7);
    std::__cxx11::string::operator=((string *)local_298._M_local_buf,"HostId");
    std::__cxx11::string::operator=((string *)&local_278,"OwnerAccount");
    aliyun::Slb::DescribeRegions
              ((SlbDescribeRegionsRequestType *)proxy_host_00,
               (SlbDescribeRegionsResponseType *)&local_298,(SlbErrorInfo *)local_358);
    HttpTestListener::WaitComplete(pHVar7);
    main_cold_12();
LAB_001091ea:
    local_398._16_2_ = 0x3231;
    local_398[0x12] = '7';
    local_398._19_4_ = 0x302e302e;
    local_398[0x17] = '.';
    local_398._24_7_ = 0x34333232313a31;
    local_398._8_8_ = 0xf;
    local_398[0x1f] = '\0';
    local_398._0_8_ = local_398 + 0x10;
    aliyun::Slb::SetProxyHost((Slb *)proxy_host_00,(string *)local_398);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,
                      CONCAT17(local_398[0x17],
                               CONCAT43(local_398._19_4_,CONCAT12(local_398[0x12],local_398._16_2_))
                              ) + 1);
    }
    if ((char)(proxy_host_00->listener_port)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(proxy_host_00->listener_port)._M_string_length + 1) = 0;
    }
    pHVar7 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar7,0x2fca);
    local_358._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_358 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,
               "{  \"BackendServers\": {    \"BackendServer\": [      {        \"ServerId\": \"ServerId\",        \"Weight\": 0      }    ]  },  \"LoadBalancerId\": \"LoadBalancerId\"}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar7,(string *)local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_358 + 0x10)) {
      operator_delete((void *)local_358._0_8_,(ulong)(local_358._16_8_ + 1));
    }
    HttpTestListener::Start(pHVar7);
    std::__cxx11::string::operator=((string *)local_298._M_local_buf,"LoadBalancerId");
    std::__cxx11::string::operator=((string *)&local_278,"BackendServers");
    std::__cxx11::string::operator=((string *)local_258._M_local_buf,"HostId");
    std::__cxx11::string::operator=((string *)local_238._M_local_buf,"OwnerAccount");
    aliyun::Slb::RemoveBackendServers
              ((SlbRemoveBackendServersRequestType *)proxy_host_00,
               (SlbRemoveBackendServersResponseType *)&local_298,
               (SlbErrorInfo *)local_318._M_local_buf);
    HttpTestListener::WaitComplete(pHVar7);
    main_cold_13();
LAB_00109334:
    local_328._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_328._M_local_buf[7] = '.';
    local_328._M_local_buf[8] = '1';
    local_328._M_local_buf[9] = ':';
    local_328._10_5_ = 0x3433323231;
    local_338._8_8_ = 0xf;
    local_328._M_local_buf[0xf] = '\0';
    local_338._M_allocated_capacity = (size_type)paVar6;
    aliyun::Slb::SetProxyHost((Slb *)proxy_host_00,(string *)&local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_allocated_capacity != paVar6) {
      operator_delete((void *)local_338._M_allocated_capacity,
                      CONCAT17(local_328._M_local_buf[7],local_328._M_allocated_capacity._0_7_) + 1)
      ;
    }
    if ((char)(proxy_host_00->listener_port)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(proxy_host_00->listener_port)._M_string_length + 1) = 0;
    }
    pHVar7 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar7,0x2fca);
    local_398._16_2_ = 0x7d7b;
    local_398._8_8_ = 2;
    local_398[0x12] = '\0';
    local_398._0_8_ = local_398 + 0x10;
    HttpTestListener::SetResponseBody(pHVar7,(string *)local_398);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,
                      CONCAT17(local_398[0x17],
                               CONCAT43(local_398._19_4_,CONCAT12(local_398[0x12],local_398._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar7);
    std::__cxx11::string::operator=((string *)local_298._M_local_buf,"LoadBalancerId");
    std::__cxx11::string::operator=((string *)&local_278,"ListenerPort");
    std::__cxx11::string::operator=((string *)local_258._M_local_buf,"XForwardedFor");
    std::__cxx11::string::operator=((string *)local_238._M_local_buf,"Scheduler");
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"StickySession");
    std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"StickySessionType");
    std::__cxx11::string::operator=((string *)local_1d8._M_local_buf,"CookieTimeout");
    std::__cxx11::string::operator=((string *)local_1b8._M_local_buf,"Cookie");
    std::__cxx11::string::operator=((string *)local_198._M_local_buf,"HealthCheck");
    std::__cxx11::string::operator=((string *)local_178._M_local_buf,"Domain");
    std::__cxx11::string::operator=((string *)local_158._M_local_buf,"URI");
    std::__cxx11::string::operator=((string *)local_138._M_local_buf,"HealthyThreshold");
    std::__cxx11::string::operator=((string *)local_118._M_local_buf,"UnhealthyThreshold");
    std::__cxx11::string::operator=((string *)&local_f8,"HealthCheckTimeout");
    std::__cxx11::string::operator=((string *)&local_d8,"Interval");
    std::__cxx11::string::operator=((string *)&local_b8,"HostId");
    std::__cxx11::string::operator=((string *)&local_98,"OwnerAccount");
    aliyun::Slb::SetLoadBalancerHTTPListenerAttribute
              (proxy_host_00,
               (SlbSetLoadBalancerHTTPListenerAttributeResponseType *)local_298._M_local_buf,
               (SlbErrorInfo *)local_358);
    HttpTestListener::WaitComplete(pHVar7);
    main_cold_14();
LAB_00109575:
    local_328._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_328._M_local_buf[7] = '.';
    local_328._M_local_buf[8] = '1';
    local_328._M_local_buf[9] = ':';
    local_328._10_5_ = 0x3433323231;
    local_338._8_8_ = 0xf;
    local_328._M_local_buf[0xf] = '\0';
    local_338._M_allocated_capacity = (size_type)paVar6;
    aliyun::Slb::SetProxyHost((Slb *)proxy_host_00,(string *)&local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_allocated_capacity != paVar6) {
      operator_delete((void *)local_338._M_allocated_capacity,
                      CONCAT17(local_328._M_local_buf[7],local_328._M_allocated_capacity._0_7_) + 1)
      ;
    }
    if ((char)(proxy_host_00->listener_port)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(proxy_host_00->listener_port)._M_string_length + 1) = 0;
    }
    pHVar7 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar7,0x2fca);
    local_398._16_2_ = 0x7d7b;
    local_398._8_8_ = 2;
    local_398[0x12] = '\0';
    local_398._0_8_ = local_398 + 0x10;
    HttpTestListener::SetResponseBody(pHVar7,(string *)local_398);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,
                      CONCAT17(local_398[0x17],
                               CONCAT43(local_398._19_4_,CONCAT12(local_398[0x12],local_398._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar7);
    std::__cxx11::string::operator=((string *)local_298._M_local_buf,"LoadBalancerId");
    std::__cxx11::string::operator=((string *)&local_278,"ListenerPort");
    std::__cxx11::string::operator=((string *)local_258._M_local_buf,"ListenerStatus");
    std::__cxx11::string::operator=((string *)local_238._M_local_buf,"HostId");
    std::__cxx11::string::operator=((string *)local_218._M_local_buf,"OwnerAccount");
    aliyun::Slb::SetLoadBalancerListenerStatus
              ((SlbSetLoadBalancerListenerStatusRequestType *)proxy_host_00,
               (SlbSetLoadBalancerListenerStatusResponseType *)local_298._M_local_buf,
               (SlbErrorInfo *)local_358);
    HttpTestListener::WaitComplete(pHVar7);
    main_cold_15();
LAB_001096c6:
    local_328._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_328._M_local_buf[7] = '.';
    local_328._M_local_buf[8] = '1';
    local_328._M_local_buf[9] = ':';
    local_328._10_5_ = 0x3433323231;
    local_338._8_8_ = 0xf;
    local_328._M_local_buf[0xf] = '\0';
    local_338._M_allocated_capacity = (size_type)paVar6;
    aliyun::Slb::SetProxyHost((Slb *)proxy_host_00,(string *)&local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_allocated_capacity != paVar6) {
      operator_delete((void *)local_338._M_allocated_capacity,
                      CONCAT17(local_328._M_local_buf[7],local_328._M_allocated_capacity._0_7_) + 1)
      ;
    }
    if ((char)(proxy_host_00->listener_port)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(proxy_host_00->listener_port)._M_string_length + 1) = 0;
    }
    pHVar7 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar7,0x2fca);
    local_398._16_2_ = 0x7d7b;
    local_398._8_8_ = 2;
    local_398[0x12] = '\0';
    local_398._0_8_ = local_398 + 0x10;
    HttpTestListener::SetResponseBody(pHVar7,(string *)local_398);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,
                      CONCAT17(local_398[0x17],
                               CONCAT43(local_398._19_4_,CONCAT12(local_398[0x12],local_398._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar7);
    std::__cxx11::string::operator=((string *)local_298._M_local_buf,"LoadBalancerId");
    std::__cxx11::string::operator=((string *)&local_278,"LoadBalancerName");
    std::__cxx11::string::operator=((string *)local_258._M_local_buf,"HostId");
    std::__cxx11::string::operator=((string *)local_238._M_local_buf,"OwnerAccount");
    aliyun::Slb::SetLoadBalancerName
              ((SlbSetLoadBalancerNameRequestType *)proxy_host_00,
               (SlbSetLoadBalancerNameResponseType *)local_298._M_local_buf,
               (SlbErrorInfo *)local_358);
    HttpTestListener::WaitComplete(pHVar7);
    main_cold_16();
LAB_00109803:
    local_328._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_328._M_local_buf[7] = '.';
    local_328._M_local_buf[8] = '1';
    local_328._M_local_buf[9] = ':';
    local_328._10_5_ = 0x3433323231;
    local_338._8_8_ = 0xf;
    local_328._M_local_buf[0xf] = '\0';
    local_338._M_allocated_capacity = (size_type)paVar6;
    aliyun::Slb::SetProxyHost((Slb *)proxy_host_00,(string *)&local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_allocated_capacity != paVar6) {
      operator_delete((void *)local_338._M_allocated_capacity,
                      CONCAT17(local_328._M_local_buf[7],local_328._M_allocated_capacity._0_7_) + 1)
      ;
    }
    if ((char)(proxy_host_00->listener_port)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(proxy_host_00->listener_port)._M_string_length + 1) = 0;
    }
    pHVar7 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar7,0x2fca);
    local_398._16_2_ = 0x7d7b;
    local_398._8_8_ = 2;
    local_398[0x12] = '\0';
    local_398._0_8_ = local_398 + 0x10;
    HttpTestListener::SetResponseBody(pHVar7,(string *)local_398);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_,
                      CONCAT17(local_398[0x17],
                               CONCAT43(local_398._19_4_,CONCAT12(local_398[0x12],local_398._16_2_))
                              ) + 1);
    }
    HttpTestListener::Start(pHVar7);
    std::__cxx11::string::operator=((string *)local_298._M_local_buf,"LoadBalancerId");
    std::__cxx11::string::operator=((string *)&local_278,"LoadBalancerStatus");
    std::__cxx11::string::operator=((string *)local_258._M_local_buf,"HostId");
    std::__cxx11::string::operator=((string *)local_238._M_local_buf,"OwnerAccount");
    aliyun::Slb::SetLoadBalancerStatus
              ((SlbSetLoadBalancerStatusRequestType *)proxy_host_00,
               (SlbSetLoadBalancerStatusResponseType *)local_298._M_local_buf,
               (SlbErrorInfo *)local_358);
    HttpTestListener::WaitComplete(pHVar7);
    main_cold_17();
  }
  local_328._M_allocated_capacity._0_7_ = 0x302e302e373231;
  local_328._M_local_buf[7] = '.';
  local_328._M_local_buf[8] = '1';
  local_328._M_local_buf[9] = ':';
  local_328._10_5_ = 0x3433323231;
  local_338._8_8_ = 0xf;
  local_328._M_local_buf[0xf] = '\0';
  local_338._M_allocated_capacity = (size_type)paVar6;
  aliyun::Slb::SetProxyHost((Slb *)proxy_host_00,(string *)&local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_allocated_capacity != paVar6) {
    operator_delete((void *)local_338._M_allocated_capacity,
                    CONCAT17(local_328._M_local_buf[7],local_328._M_allocated_capacity._0_7_) + 1);
  }
  if ((char)(proxy_host_00->listener_port)._M_string_length == '\x01') {
    *(undefined1 *)((long)&(proxy_host_00->listener_port)._M_string_length + 1) = 0;
  }
  pHVar7 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar7,0x2fca);
  local_398._16_2_ = 0x7d7b;
  local_398._8_8_ = 2;
  local_398[0x12] = '\0';
  local_398._0_8_ = local_398 + 0x10;
  HttpTestListener::SetResponseBody(pHVar7,(string *)local_398);
  if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
    operator_delete((void *)local_398._0_8_,
                    CONCAT17(local_398[0x17],
                             CONCAT43(local_398._19_4_,CONCAT12(local_398[0x12],local_398._16_2_)))
                    + 1);
  }
  HttpTestListener::Start(pHVar7);
  std::__cxx11::string::operator=((string *)local_298._M_local_buf,"LoadBalancerId");
  std::__cxx11::string::operator=((string *)&local_278,"ListenerPort");
  std::__cxx11::string::operator=((string *)local_258._M_local_buf,"Scheduler");
  std::__cxx11::string::operator=((string *)local_238._M_local_buf,"PersistenceTimeout");
  std::__cxx11::string::operator=((string *)local_218._M_local_buf,"HealthCheck");
  std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,"HealthyThreshold");
  std::__cxx11::string::operator=((string *)local_1d8._M_local_buf,"UnhealthyThreshold");
  std::__cxx11::string::operator=((string *)local_1b8._M_local_buf,"ConnectTimeout");
  std::__cxx11::string::operator=((string *)local_198._M_local_buf,"ConnectPort");
  std::__cxx11::string::operator=((string *)local_178._M_local_buf,"Interval");
  std::__cxx11::string::operator=((string *)local_158._M_local_buf,"HostId");
  std::__cxx11::string::operator=((string *)local_138._M_local_buf,"OwnerAccount");
  aliyun::Slb::SetLoadBalancerTCPListenerAttribute
            ((SlbSetLoadBalancerTCPListenerAttributeRequestType *)proxy_host_00,
             (SlbSetLoadBalancerTCPListenerAttributeResponseType *)local_298._M_local_buf,
             (SlbErrorInfo *)local_358);
  HttpTestListener::WaitComplete(pHVar7);
  main_cold_18();
LAB_00109b1d:
  local_328._M_allocated_capacity._0_7_ = 0x302e302e373231;
  local_328._M_local_buf[7] = '.';
  local_328._M_local_buf[8] = '1';
  local_328._M_local_buf[9] = ':';
  local_328._10_5_ = 0x3433323231;
  local_338._8_8_ = 0xf;
  local_328._M_local_buf[0xf] = '\0';
  local_338._M_allocated_capacity = (size_type)paVar6;
  aliyun::Slb::SetProxyHost((Slb *)proxy_host_00,(string *)&local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_allocated_capacity != paVar6) {
    operator_delete((void *)local_338._M_allocated_capacity,
                    CONCAT17(local_328._M_local_buf[7],local_328._M_allocated_capacity._0_7_) + 1);
  }
  if ((char)(proxy_host_00->listener_port)._M_string_length == '\x01') {
    *(undefined1 *)((long)&(proxy_host_00->listener_port)._M_string_length + 1) = 0;
  }
  pHVar7 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar7,0x2fca);
  local_398._16_2_ = 0x7d7b;
  local_398._8_8_ = 2;
  local_398[0x12] = '\0';
  local_398._0_8_ = local_398 + 0x10;
  HttpTestListener::SetResponseBody(pHVar7,(string *)local_398);
  if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
    operator_delete((void *)local_398._0_8_,
                    CONCAT17(local_398[0x17],
                             CONCAT43(local_398._19_4_,CONCAT12(local_398[0x12],local_398._16_2_)))
                    + 1);
  }
  HttpTestListener::Start(pHVar7);
  std::__cxx11::string::operator=((string *)local_298._M_local_buf,"LoadBalancerId");
  std::__cxx11::string::operator=((string *)&local_278,"ListenerPort");
  std::__cxx11::string::operator=((string *)local_258._M_local_buf,"ListenerStatus");
  std::__cxx11::string::operator=((string *)local_238._M_local_buf,"HostId");
  std::__cxx11::string::operator=((string *)local_218._M_local_buf,"OwnerAccount");
  aliyun::Slb::SetLoadBanancerListenerStatus
            ((SlbSetLoadBanancerListenerStatusRequestType *)proxy_host_00,
             (SlbSetLoadBanancerListenerStatusResponseType *)local_298._M_local_buf,
             (SlbErrorInfo *)local_358);
  HttpTestListener::WaitComplete(pHVar7);
  main_cold_19();
  aliyun::SlbCreateLoadBalancerHTTPListenerRequestType::
  ~SlbCreateLoadBalancerHTTPListenerRequestType
            ((SlbCreateLoadBalancerHTTPListenerRequestType *)&local_298);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main() {
  test_add_backend_servers();
  test_create_load_balancer();
  test_create_load_balancer_ht_tp_listener();
  test_create_load_balancer_tc_plistener();
  test_delete_load_balancer();
  test_delete_load_balancer_listener();
  test_describe_backend_servers();
  test_describe_load_balancer_attribute();
  test_describe_load_balancer_ht_tp_listener_attribute();
  test_describe_load_balancers();
  test_describe_load_balancer_tc_plistener_attribute();
  test_describe_regions();
  test_remove_backend_servers();
  test_set_load_balancer_ht_tp_listener_attribute();
  test_set_load_balancer_listener_status();
  test_set_load_balancer_name();
  test_set_load_balancer_status();
  test_set_load_balancer_tc_plistener_attribute();
  test_set_load_banancer_listener_status();
}